

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<unsigned_long>(string *__return_storage_ptr__,unsigned_long *arg)

{
  std::__cxx11::to_string(__return_storage_ptr__,*arg);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg)
{
    return std::to_string(arg);
}